

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O2

size_t copy_data_to_tmp(estate s,FFSBuffer buf,void *data,size_t length,int req_alignment,
                       size_t *tmp_data_loc)

{
  int iVar1;
  internal_iovec *piVar2;
  size_t in_RAX;
  size_t sVar3;
  size_t tmp_data;
  size_t local_38;
  
  local_38 = in_RAX;
  sVar3 = allocate_tmp_space(s,buf,length,req_alignment,&local_38);
  if (length != 0) {
    memcpy((void *)((long)buf->tmp_buffer + local_38),data,length);
    piVar2 = s->iovec;
    iVar1 = s->iovcnt;
    piVar2[iVar1].iov_len = length;
    piVar2[iVar1].iov_offset = local_38;
    piVar2[iVar1].iov_base = (void *)0x0;
    s->iovcnt = iVar1 + 1;
  }
  if (tmp_data_loc != (size_t *)0x0) {
    *tmp_data_loc = local_38;
  }
  return sVar3;
}

Assistant:

size_t
copy_data_to_tmp(estate s, FFSBuffer buf, void *data, size_t length, int req_alignment, size_t *tmp_data_loc)
{
    size_t tmp_data;
    size_t msg_offset = allocate_tmp_space(s, buf, length, req_alignment, &tmp_data);
    if (length != 0) {
	memcpy((char*)buf->tmp_buffer + tmp_data, data, length);
	s->iovec[s->iovcnt].iov_len = length;
	s->iovec[s->iovcnt].iov_offset = tmp_data;
	s->iovec[s->iovcnt].iov_base = NULL;
	s->iovcnt++;
    }
    if (tmp_data_loc) *tmp_data_loc = tmp_data;
    return msg_offset;
}